

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O0

int av1_full_pixel_search
              (FULLPEL_MV start_mv,FULLPEL_MOTION_SEARCH_PARAMS *ms_params,int step_param,
              int *cost_list,FULLPEL_MV *best_mv,FULLPEL_MV_STATS *best_mv_stats,
              FULLPEL_MV *second_best_mv)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  int iVar4;
  int iVar5;
  FULLPEL_MOTION_SEARCH_PARAMS *ms_params_00;
  uint8_t *puVar6;
  int iVar7;
  undefined4 *in_RCX;
  undefined4 in_EDX;
  byte *in_RSI;
  undefined4 in_EDI;
  int *in_R8;
  FULLPEL_MV *in_R9;
  FULLPEL_MV *unaff_retaddr;
  FULLPEL_MV *in_stack_00000008;
  MESH_PATTERN *mesh_patterns;
  FULLPEL_MV_STATS tmp_mv_stats;
  FULLPEL_MV tmp_mv_ex;
  int var_ex;
  FULLPEL_MOTION_SEARCH_PARAMS new_ms_params;
  int kSADThresh;
  int skip_sad;
  int sad;
  uint8_t *best_address;
  uint8_t *src_address;
  int ref_stride;
  int src_stride;
  buf_2d *ref;
  buf_2d *src;
  int full_pel_mv_diff;
  int exhaustive_thr;
  int var;
  int run_mesh_search;
  int is_intra_mode;
  SEARCH_METHODS search_method;
  BLOCK_SIZE bsize;
  FULLPEL_MV *in_stack_fffffffffffffe58;
  buf_2d *in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  int in_stack_fffffffffffffe70;
  int in_stack_fffffffffffffe74;
  int iVar8;
  undefined8 in_stack_fffffffffffffe80;
  FULLPEL_MV start_mv_00;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  undefined4 in_stack_fffffffffffffe90;
  FULLPEL_MV in_stack_fffffffffffffe94;
  int local_168;
  FULLPEL_MV_STATS *in_stack_fffffffffffffea0;
  FULLPEL_MV_STATS *in_stack_fffffffffffffec8;
  FULLPEL_MV *in_stack_fffffffffffffed0;
  int *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee4;
  FULLPEL_MOTION_SEARCH_PARAMS *in_stack_fffffffffffffee8;
  FULLPEL_MV in_stack_fffffffffffffef0;
  FULLPEL_MV in_stack_fffffffffffffef4;
  FULLPEL_MV *in_stack_ffffffffffffff60;
  int local_40;
  int local_3c;
  undefined2 in_stack_ffffffffffffffcc;
  byte bVar9;
  byte bVar10;
  FULLPEL_MV *pFVar11;
  undefined4 in_stack_ffffffffffffffe8;
  short local_8;
  short sStack_6;
  
  bVar10 = *in_RSI;
  bVar9 = in_RSI[0x48];
  iVar5 = *(int *)(in_RSI + 0x8c);
  local_3c = *(int *)(in_RSI + 0x68);
  local_40 = 0;
  *in_R8 = -0x7fff8000;
  if (in_stack_00000008 != (FULLPEL_MV *)0x0) {
    in_stack_00000008->row = -0x8000;
    in_stack_00000008->col = -0x8000;
  }
  if (in_RCX != (undefined4 *)0x0) {
    *in_RCX = 0x7fffffff;
    in_RCX[1] = 0x7fffffff;
    in_RCX[2] = 0x7fffffff;
    in_RCX[3] = 0x7fffffff;
    in_RCX[4] = 0x7fffffff;
  }
  ms_params_00 = (FULLPEL_MOTION_SEARCH_PARAMS *)(ulong)bVar9;
  iVar8 = (int)in_stack_fffffffffffffe80;
  start_mv_00 = SUB84((ulong)in_stack_fffffffffffffe80 >> 0x20,0);
  switch(ms_params_00) {
  case (FULLPEL_MOTION_SEARCH_PARAMS *)0x0:
  case (FULLPEL_MOTION_SEARCH_PARAMS *)0x1:
  case (FULLPEL_MOTION_SEARCH_PARAMS *)0x2:
  case (FULLPEL_MOTION_SEARCH_PARAMS *)0x3:
    local_40 = full_pixel_diamond(in_stack_fffffffffffffef4,in_stack_fffffffffffffee8,
                                  in_stack_fffffffffffffee4,in_stack_fffffffffffffed8,
                                  in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                                  in_stack_ffffffffffffff60);
    in_stack_fffffffffffffe58 = in_stack_00000008;
    break;
  case (FULLPEL_MOTION_SEARCH_PARAMS *)0x4:
    pFVar11 = in_R9;
    local_40 = hex_search(start_mv_00,ms_params_00,in_stack_fffffffffffffe74,
                          in_stack_fffffffffffffe70,
                          (int *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                          (FULLPEL_MV *)in_stack_fffffffffffffe60,
                          (FULLPEL_MV_STATS *)
                          CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
    in_stack_fffffffffffffe58 = in_R9;
    in_R9 = pFVar11;
    break;
  case (FULLPEL_MOTION_SEARCH_PARAMS *)0x5:
    pFVar11 = in_R9;
    local_40 = bigdia_search(start_mv_00,ms_params_00,in_stack_fffffffffffffe74,
                             in_stack_fffffffffffffe70,
                             (int *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                             (FULLPEL_MV *)in_stack_fffffffffffffe60,
                             (FULLPEL_MV_STATS *)
                             CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
    in_stack_fffffffffffffe58 = in_R9;
    in_R9 = pFVar11;
    break;
  case (FULLPEL_MOTION_SEARCH_PARAMS *)0x6:
    pFVar11 = in_R9;
    local_40 = square_search(start_mv_00,ms_params_00,in_stack_fffffffffffffe74,
                             in_stack_fffffffffffffe70,
                             (int *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                             (FULLPEL_MV *)in_stack_fffffffffffffe60,
                             (FULLPEL_MV_STATS *)
                             CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
    in_stack_fffffffffffffe58 = in_R9;
    in_R9 = pFVar11;
    break;
  case (FULLPEL_MOTION_SEARCH_PARAMS *)0x7:
    pFVar11 = in_R9;
    local_40 = fast_hex_search(in_stack_fffffffffffffe94,
                               (FULLPEL_MOTION_SEARCH_PARAMS *)
                               CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                               (int)start_mv_00,iVar8,(int *)ms_params_00,
                               (FULLPEL_MV *)
                               CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                               in_stack_fffffffffffffea0);
    in_stack_fffffffffffffe58 = in_R9;
    in_R9 = pFVar11;
    break;
  case (FULLPEL_MOTION_SEARCH_PARAMS *)0x8:
    pFVar11 = in_R9;
    local_40 = fast_dia_search(in_stack_fffffffffffffe94,
                               (FULLPEL_MOTION_SEARCH_PARAMS *)
                               CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                               (int)start_mv_00,iVar8,(int *)ms_params_00,
                               (FULLPEL_MV *)
                               CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                               in_stack_fffffffffffffea0);
    in_stack_fffffffffffffe58 = in_R9;
    in_R9 = pFVar11;
    break;
  case (FULLPEL_MOTION_SEARCH_PARAMS *)0x9:
    pFVar11 = in_R9;
    local_40 = fast_bigdia_search(in_stack_fffffffffffffe94,
                                  (FULLPEL_MOTION_SEARCH_PARAMS *)
                                  CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                                  (int)start_mv_00,iVar8,(int *)ms_params_00,
                                  (FULLPEL_MV *)
                                  CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                                  in_stack_fffffffffffffea0);
    in_stack_fffffffffffffe58 = in_R9;
    in_R9 = pFVar11;
    break;
  case (FULLPEL_MOTION_SEARCH_PARAMS *)0xa:
    pFVar11 = in_R9;
    local_40 = vfast_dia_search(in_stack_fffffffffffffe94,
                                (FULLPEL_MOTION_SEARCH_PARAMS *)
                                CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                                (int)start_mv_00,iVar8,(int *)ms_params_00,
                                (FULLPEL_MV *)
                                CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                                in_stack_fffffffffffffea0);
    in_stack_fffffffffffffe58 = in_R9;
    in_R9 = pFVar11;
  }
  iVar8 = (int)((ulong)in_RCX >> 0x20);
  if ((local_3c == 0) &&
     ((((bVar9 == 1 || (bVar9 == 2)) && (*(long *)(in_RSI + 0x20) == 0)) &&
      (*(int *)(in_RSI + 0x74) >> (10 - (""[bVar10] + ""[bVar10]) & 0x1f) < local_40)))) {
    local_3c = 1;
  }
  if ((iVar5 == 0) && (*(int *)(in_RSI + 0x6c) != 0)) {
    local_8 = (short)in_EDI;
    iVar4 = (int)local_8 - (int)(short)*in_R8;
    if (iVar4 < 1) {
      iVar4 = -iVar4;
    }
    sStack_6 = (short)((uint)in_EDI >> 0x10);
    iVar7 = (int)sStack_6 - (int)*(short *)((long)in_R8 + 2);
    if (iVar7 < 1) {
      iVar7 = -iVar7;
    }
    if (iVar7 < iVar4) {
      iVar4 = (int)local_8 - (int)(short)*in_R8;
      if (iVar4 < 1) {
        iVar4 = -iVar4;
      }
    }
    else {
      iVar4 = (int)sStack_6 - (int)*(short *)((long)in_R8 + 2);
      if (iVar4 < 1) {
        iVar4 = -iVar4;
      }
    }
    if (iVar4 <= *(int *)(in_RSI + 0x70)) {
      local_3c = 0;
    }
  }
  if (*(long *)(in_RSI + 200) != **(long **)(in_RSI + 8)) {
    uVar1 = *(undefined4 *)(*(undefined8 **)(in_RSI + 0x18) + 3);
    uVar2 = *(undefined4 *)(*(long *)(in_RSI + 0x10) + 0x18);
    uVar3 = **(undefined8 **)(in_RSI + 0x18);
    puVar6 = get_buf_from_fullmv(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    iVar7 = (*(code *)**(undefined8 **)(in_RSI + 8))(uVar3,uVar1,puVar6,uVar2);
    iVar4 = (**(code **)(*(long *)(in_RSI + 8) + 8))(uVar3,uVar1,puVar6,uVar2);
    if (1 << (""[bVar10] + ""[bVar10] & 0x1f) < iVar7) {
      iVar4 = iVar4 - iVar7;
      if (iVar4 < 1) {
        iVar4 = -iVar4;
      }
      if (iVar7 < 2) {
        iVar7 = 1;
      }
      if (SBORROW4(iVar4 * 10,iVar7 * 9) == iVar4 * 10 + iVar7 * -9 < 0) {
        memcpy(&stack0xfffffffffffffea0,in_RSI,0xe0);
        iVar5 = av1_full_pixel_search
                          (SUB84(in_RSI,0),
                           (FULLPEL_MOTION_SEARCH_PARAMS *)
                           CONCAT44(in_EDX,in_stack_ffffffffffffffe8),iVar8,in_R8,in_R9,
                           (FULLPEL_MV_STATS *)
                           CONCAT17(bVar10,CONCAT16(bVar9,CONCAT24(in_stack_ffffffffffffffcc,iVar5))
                                   ),unaff_retaddr);
        return iVar5;
      }
    }
  }
  if ((local_3c != 0) &&
     (iVar5 = full_pixel_exhaustive
                        (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                         (MESH_PATTERN *)
                         CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                         in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                         in_stack_fffffffffffffec8,in_stack_ffffffffffffff60), iVar5 < local_40)) {
    *(ulong *)in_R9 = CONCAT44(in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
    in_R9[2] = in_stack_fffffffffffffe94;
    *in_R8 = local_168;
    local_40 = iVar5;
  }
  return local_40;
}

Assistant:

int av1_full_pixel_search(const FULLPEL_MV start_mv,
                          const FULLPEL_MOTION_SEARCH_PARAMS *ms_params,
                          const int step_param, int *cost_list,
                          FULLPEL_MV *best_mv, FULLPEL_MV_STATS *best_mv_stats,
                          FULLPEL_MV *second_best_mv) {
  const BLOCK_SIZE bsize = ms_params->bsize;
  const SEARCH_METHODS search_method = ms_params->search_method;

  const int is_intra_mode = ms_params->is_intra_mode;
  int run_mesh_search = ms_params->run_mesh_search;

  int var = 0;
  MARK_MV_INVALID(best_mv);
  if (second_best_mv) {
    MARK_MV_INVALID(second_best_mv);
  }

  if (cost_list) {
    cost_list[0] = INT_MAX;
    cost_list[1] = INT_MAX;
    cost_list[2] = INT_MAX;
    cost_list[3] = INT_MAX;
    cost_list[4] = INT_MAX;
  }

  assert(ms_params->ms_buffers.ref->stride == ms_params->search_sites->stride);

  switch (search_method) {
    case FAST_BIGDIA:
      var = fast_bigdia_search(start_mv, ms_params, step_param, 0, cost_list,
                               best_mv, best_mv_stats);
      break;
    case VFAST_DIAMOND:
      var = vfast_dia_search(start_mv, ms_params, step_param, 0, cost_list,
                             best_mv, best_mv_stats);
      break;
    case FAST_DIAMOND:
      var = fast_dia_search(start_mv, ms_params, step_param, 0, cost_list,
                            best_mv, best_mv_stats);
      break;
    case FAST_HEX:
      var = fast_hex_search(start_mv, ms_params, step_param, 0, cost_list,
                            best_mv, best_mv_stats);
      break;
    case HEX:
      var = hex_search(start_mv, ms_params, step_param, 1, cost_list, best_mv,
                       best_mv_stats);
      break;
    case SQUARE:
      var = square_search(start_mv, ms_params, step_param, 1, cost_list,
                          best_mv, best_mv_stats);
      break;
    case BIGDIA:
      var = bigdia_search(start_mv, ms_params, step_param, 1, cost_list,
                          best_mv, best_mv_stats);
      break;
    case NSTEP:
    case NSTEP_8PT:
    case DIAMOND:
    case CLAMPED_DIAMOND:
      var = full_pixel_diamond(start_mv, ms_params, step_param, cost_list,
                               best_mv, best_mv_stats, second_best_mv);
      break;
    default: assert(0 && "Invalid search method.");
  }

  // Should we allow a follow on exhaustive search?
  if (!run_mesh_search &&
      ((search_method == NSTEP) || (search_method == NSTEP_8PT)) &&
      !ms_params->ms_buffers.second_pred) {
    int exhaustive_thr = ms_params->force_mesh_thresh;
    exhaustive_thr >>=
        10 - (mi_size_wide_log2[bsize] + mi_size_high_log2[bsize]);
    // Threshold variance for an exhaustive full search.
    if (var > exhaustive_thr) run_mesh_search = 1;
  }

  // TODO(yunqing): the following is used to reduce mesh search in temporal
  // filtering. Can extend it to intrabc.
  if (!is_intra_mode && ms_params->prune_mesh_search) {
    const int full_pel_mv_diff = AOMMAX(abs(start_mv.row - best_mv->row),
                                        abs(start_mv.col - best_mv->col));
    if (full_pel_mv_diff <= ms_params->mesh_search_mv_diff_threshold) {
      run_mesh_search = 0;
    }
  }

  if (ms_params->sdf != ms_params->vfp->sdf) {
    // If we are skipping rows when we perform the motion search, we need to
    // check the quality of skipping. If it's bad, then we run mesh search with
    // skip row features off.
    // TODO(chiyotsai@google.com): Handle the case where we have a vertical
    // offset of 1 before we hit this statement to avoid having to redo
    // motion search.
    const struct buf_2d *src = ms_params->ms_buffers.src;
    const struct buf_2d *ref = ms_params->ms_buffers.ref;
    const int src_stride = src->stride;
    const int ref_stride = ref->stride;

    const uint8_t *src_address = src->buf;
    const uint8_t *best_address = get_buf_from_fullmv(ref, best_mv);
    const int sad =
        ms_params->vfp->sdf(src_address, src_stride, best_address, ref_stride);
    const int skip_sad =
        ms_params->vfp->sdsf(src_address, src_stride, best_address, ref_stride);
    // We will keep the result of skipping rows if it's good enough. Here, good
    // enough means the error is less than 1 per pixel.
    const int kSADThresh =
        1 << (mi_size_wide_log2[bsize] + mi_size_high_log2[bsize]);
    if (sad > kSADThresh && abs(skip_sad - sad) * 10 >= AOMMAX(sad, 1) * 9) {
      // There is a large discrepancy between skipping and not skipping, so we
      // need to redo the motion search.
      FULLPEL_MOTION_SEARCH_PARAMS new_ms_params = *ms_params;
      new_ms_params.sdf = new_ms_params.vfp->sdf;
      new_ms_params.sdx4df = new_ms_params.vfp->sdx4df;
      new_ms_params.sdx3df = new_ms_params.vfp->sdx3df;

      return av1_full_pixel_search(start_mv, &new_ms_params, step_param,
                                   cost_list, best_mv, best_mv_stats,
                                   second_best_mv);
    }
  }

  if (run_mesh_search) {
    int var_ex;
    FULLPEL_MV tmp_mv_ex;
    FULLPEL_MV_STATS tmp_mv_stats;
    // Pick the mesh pattern for exhaustive search based on the toolset (intraBC
    // or non-intraBC)
    // TODO(chiyotsai@google.com):  There is a bug here where the second best mv
    // gets overwritten without actually comparing the rdcost.
    const MESH_PATTERN *const mesh_patterns =
        ms_params->mesh_patterns[is_intra_mode];
    // TODO(chiyotsai@google.com): the second best mv is not set correctly by
    // full_pixel_exhaustive, which can incorrectly override it.
    var_ex =
        full_pixel_exhaustive(*best_mv, ms_params, mesh_patterns, cost_list,
                              &tmp_mv_ex, &tmp_mv_stats, second_best_mv);
    if (var_ex < var) {
      var = var_ex;
      *best_mv_stats = tmp_mv_stats;
      *best_mv = tmp_mv_ex;
    }
  }

  return var;
}